

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::flip23(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  triface *newtet;
  int iVar1;
  uint uVar2;
  tetrahedron *pppdVar3;
  memorypool *pmVar4;
  tetrahedron ppdVar5;
  double *pdVar6;
  tetrahedron p0;
  tetrahedron p1;
  int i;
  long lVar7;
  tetrahedron ppdVar8;
  long lVar9;
  ulong *puVar10;
  tetrahedron *pppdVar11;
  int *piVar12;
  tetrahedron p2;
  ulong uVar13;
  ulong uVar14;
  tetgenmesh *ptVar15;
  int iVar16;
  uint uVar17;
  undefined8 in_R10;
  tetrahedron p3;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  triface topcastets [3];
  triface botcastets [3];
  triface local_110;
  undefined4 local_fc;
  flipconstraints *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  tetrahedron local_e8;
  tetrahedron local_e0;
  tetrahedron local_d8;
  int local_cc;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  tetrahedron local_a8;
  tetrahedron local_a0;
  ulong uStack_98;
  uint local_90 [8];
  ulong uStack_70;
  ulong uStack_68;
  uint local_60 [12];
  
  lVar7 = 8;
  do {
    *(undefined8 *)((long)&local_a0 + lVar7) = 0;
    *(undefined4 *)((long)local_90 + lVar7 + -8) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  lVar7 = 8;
  do {
    *(undefined8 *)((long)&uStack_70 + lVar7) = 0;
    *(undefined4 *)((long)local_60 + lVar7 + -8) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  local_110.tet = (tetrahedron *)0x0;
  local_110.ver = 0;
  if (hullflag < 1) {
LAB_0011c80b:
    local_ec = 0;
    local_f0 = 0;
    local_fc = 0;
  }
  else {
    pppdVar11 = fliptets->tet;
    iVar16 = fliptets[1].ver;
    ppdVar8 = (tetrahedron)this->dummypoint;
    bVar18 = fliptets[1].tet[oppopivot[iVar16]] == ppdVar8;
    if (bVar18) {
      iVar1 = fliptets->ver;
      fliptets->tet = fliptets[1].tet;
      fliptets->ver = iVar16;
      fliptets[1].tet = pppdVar11;
      local_110.tet = pppdVar11;
      local_110.ver = iVar1;
LAB_0011c877:
      local_fc = 0;
    }
    else {
      iVar1 = fliptets->ver;
      if (pppdVar11[orgpivot[iVar1]] != ppdVar8) {
        if (pppdVar11[destpivot[iVar1]] != ppdVar8) goto LAB_0011c80b;
        fliptets->ver = eprevtbl[iVar1];
        iVar1 = enexttbl[iVar16];
        goto LAB_0011c877;
      }
      fliptets->ver = enexttbl[iVar1];
      iVar1 = eprevtbl[iVar16];
      local_fc = 0x185601;
    }
    local_f0 = (undefined4)CONCAT71((int7)((ulong)in_R10 >> 8),bVar18);
    fliptets[1].ver = iVar1;
    local_ec = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
  }
  pppdVar11 = fliptets->tet;
  pppdVar3 = fliptets[1].tet;
  iVar16 = fliptets->ver;
  local_d8 = pppdVar11[orgpivot[iVar16]];
  local_e0 = pppdVar11[destpivot[iVar16]];
  local_e8 = pppdVar11[apexpivot[iVar16]];
  local_a0 = pppdVar11[oppopivot[iVar16]];
  local_a8 = pppdVar3[oppopivot[fliptets[1].ver]];
  this->flip23count = this->flip23count + 1;
  iVar16 = fliptets->ver;
  lVar7 = 8;
  do {
    ppdVar8 = pppdVar11[facepivot1[iVar16]];
    uVar17 = (uint)ppdVar8 & 0xf;
    *(uint *)((long)local_90 + lVar7 + -8) = uVar17;
    *(ulong *)((long)&local_a0 + lVar7) = (ulong)ppdVar8 & 0xfffffffffffffff0;
    *(int *)((long)local_90 + lVar7 + -8) = facepivot2[iVar16][uVar17];
    iVar16 = enexttbl[iVar16];
    fliptets->ver = iVar16;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  iVar16 = fliptets[1].ver;
  lVar7 = 8;
  do {
    ppdVar8 = pppdVar3[facepivot1[iVar16]];
    uVar17 = (uint)ppdVar8 & 0xf;
    *(uint *)((long)local_60 + lVar7 + -8) = uVar17;
    *(ulong *)((long)&uStack_70 + lVar7) = (ulong)ppdVar8 & 0xfffffffffffffff0;
    *(int *)((long)local_60 + lVar7 + -8) = facepivot2[iVar16][uVar17];
    iVar16 = eprevtbl[iVar16];
    fliptets[1].ver = iVar16;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  *(undefined4 *)((long)pppdVar11 + (long)this->elemmarkerindex * 4) = 0;
  *(undefined4 *)((long)pppdVar3 + (long)this->elemmarkerindex * 4) = 0;
  if (this->checksubsegflag != 0) {
    ppdVar8 = pppdVar11[8];
    if (ppdVar8 != (tetrahedron)0x0) {
      pmVar4 = this->tet2segpool;
      *ppdVar8 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar8;
      pmVar4->items = pmVar4->items + -1;
      fliptets->tet[8] = (tetrahedron)0x0;
    }
    ppdVar8 = fliptets[1].tet[8];
    if (ppdVar8 != (tetrahedron)0x0) {
      pmVar4 = this->tet2segpool;
      *ppdVar8 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar8;
      pmVar4->items = pmVar4->items + -1;
      fliptets[1].tet[8] = (tetrahedron)0x0;
    }
  }
  if (this->checksubfaceflag != 0) {
    ppdVar8 = fliptets->tet[9];
    if (ppdVar8 != (tetrahedron)0x0) {
      pmVar4 = this->tet2subpool;
      *ppdVar8 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar8;
      pmVar4->items = pmVar4->items + -1;
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    ppdVar8 = fliptets[1].tet[9];
    if (ppdVar8 != (tetrahedron)0x0) {
      pmVar4 = this->tet2subpool;
      *ppdVar8 = (double *)pmVar4->deaditemstack;
      pmVar4->deaditemstack = ppdVar8;
      pmVar4->items = pmVar4->items + -1;
      fliptets[1].tet[9] = (tetrahedron)0x0;
    }
  }
  newtet = fliptets + 2;
  local_f8 = fc;
  maketetrahedron(this,newtet);
  p1 = local_a0;
  p0 = local_a8;
  p3 = local_d8;
  ppdVar8 = local_e0;
  iVar16 = this->numelemattrib;
  if (0 < (long)iVar16) {
    iVar1 = this->elemattribindex;
    pppdVar11 = fliptets->tet;
    pppdVar3 = fliptets[2].tet;
    lVar7 = 0;
    do {
      pppdVar3[iVar1 + lVar7] = pppdVar11[iVar1 + lVar7];
      lVar7 = lVar7 + 1;
    } while (iVar16 != lVar7);
  }
  if (this->b->varvolume != 0) {
    fliptets[2].tet[this->volumeboundindex] = fliptets->tet[this->volumeboundindex];
  }
  if (hullflag < 1) {
    iVar16 = fliptets->ver;
    fliptets->tet[orgpivot[iVar16]] = local_a8;
    fliptets->tet[destpivot[iVar16]] = local_a0;
    fliptets->tet[apexpivot[iVar16]] = local_d8;
    fliptets->tet[oppopivot[iVar16]] = local_e0;
    iVar16 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar16]] = local_a8;
    fliptets[1].tet[destpivot[iVar16]] = local_a0;
    fliptets[1].tet[apexpivot[iVar16]] = local_e0;
    fliptets[1].tet[oppopivot[iVar16]] = local_e8;
    iVar16 = fliptets[2].ver;
    fliptets[2].tet[orgpivot[iVar16]] = local_a8;
    fliptets[2].tet[destpivot[iVar16]] = local_a0;
    fliptets[2].tet[apexpivot[iVar16]] = local_e8;
    fliptets[2].tet[oppopivot[iVar16]] = local_d8;
  }
  else {
    iVar16 = fliptets->ver;
    if (local_a0 == (tetrahedron)this->dummypoint) {
      fliptets->tet[orgpivot[iVar16]] = local_d8;
      fliptets->tet[destpivot[iVar16]] = local_e0;
      fliptets->tet[apexpivot[iVar16]] = local_a8;
      fliptets->tet[oppopivot[iVar16]] = local_a0;
      iVar16 = fliptets[1].ver;
      fliptets[1].tet[orgpivot[iVar16]] = local_e0;
      fliptets[1].tet[destpivot[iVar16]] = local_e8;
      fliptets[1].tet[apexpivot[iVar16]] = local_a8;
      fliptets[1].tet[oppopivot[iVar16]] = local_a0;
      iVar16 = fliptets[2].ver;
      fliptets[2].tet[orgpivot[iVar16]] = local_e8;
      fliptets[2].tet[destpivot[iVar16]] = local_d8;
      fliptets[2].tet[apexpivot[iVar16]] = local_a8;
      fliptets[2].tet[oppopivot[iVar16]] = local_a0;
      lVar7 = 8;
      do {
        iVar16 = eprevesymtbl[*(int *)((long)&fliptets->tet + lVar7)];
        *(int *)((long)&fliptets->tet + lVar7) = iVar16;
        *(int *)((long)&fliptets->tet + lVar7) = enexttbl[iVar16];
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x38);
      this->hullsize = this->hullsize + 2;
    }
    else {
      fliptets->tet[orgpivot[iVar16]] = local_a8;
      fliptets->tet[destpivot[iVar16]] = local_a0;
      fliptets->tet[apexpivot[iVar16]] = local_d8;
      fliptets->tet[oppopivot[iVar16]] = local_e0;
      iVar16 = fliptets[1].ver;
      fliptets[1].tet[orgpivot[iVar16]] = local_a8;
      fliptets[1].tet[destpivot[iVar16]] = local_a0;
      fliptets[1].tet[apexpivot[iVar16]] = local_e0;
      fliptets[1].tet[oppopivot[iVar16]] = local_e8;
      iVar16 = fliptets[2].ver;
      if (local_e8 == (tetrahedron)this->dummypoint) {
        fliptets[2].tet[orgpivot[iVar16]] = local_a0;
        fliptets[2].tet[destpivot[iVar16]] = local_a8;
        fliptets[2].tet[apexpivot[iVar16]] = local_d8;
        fliptets[2].tet[oppopivot[iVar16]] = local_e8;
        fliptets[2].ver = esymtbl[fliptets[2].ver];
      }
      else {
        fliptets[2].tet[orgpivot[iVar16]] = local_a8;
        newtet->tet[destpivot[iVar16]] = local_a0;
        newtet->tet[apexpivot[iVar16]] = local_e8;
        newtet->tet[oppopivot[iVar16]] = local_d8;
      }
    }
  }
  local_cc = hullflag;
  if (local_f8->remove_ndelaunay_edge != 0) {
    ppdVar5 = (tetrahedron)this->dummypoint;
    ptVar15 = this;
    if (local_a0 == ppdVar5) {
      local_c8 = 0.0;
      local_c0 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
      p2 = local_e8;
LAB_0011cea7:
      dVar20 = tetprismvol(ptVar15,(double *)ppdVar8,(double *)p3,(double *)p2,(double *)p0);
      dVar19 = local_b0;
      dVar21 = local_b8;
      dVar22 = local_c0;
      dVar23 = local_c8;
    }
    else {
      dVar19 = tetprismvol(this,(double *)local_a8,(double *)local_a0,(double *)local_d8,
                           (double *)local_e0);
      p2 = local_e8;
      if (local_e8 != ppdVar5) {
        local_b0 = dVar19;
        local_b8 = tetprismvol(ptVar15,(double *)p0,(double *)p1,(double *)ppdVar8,
                               (double *)local_e8);
        local_c0 = tetprismvol(ptVar15,(double *)p0,(double *)p1,(double *)p2,(double *)p3);
        local_c8 = tetprismvol(ptVar15,(double *)p3,(double *)ppdVar8,(double *)p2,(double *)p1);
        goto LAB_0011cea7;
      }
      dVar20 = 0.0;
      dVar23 = 0.0;
      dVar22 = 0.0;
      dVar21 = 0.0;
    }
    local_f8->tetprism_vol_sum =
         (((dVar21 + dVar19 + dVar22) - dVar23) - dVar20) + local_f8->tetprism_vol_sum;
  }
  piVar12 = &fliptets->ver;
  lVar7 = 1;
  do {
    pppdVar11 = ((triface *)(piVar12 + -2))->tet;
    uVar17 = esymtbl[*piVar12];
    lVar9 = lVar7;
    if (lVar7 == 3) {
      lVar9 = 0;
    }
    uVar2 = fliptets[lVar9].ver;
    pppdVar11[uVar17 & 3] =
         (tetrahedron)((long)bondtbl[(int)uVar17][(int)uVar2] | (ulong)fliptets[lVar9].tet);
    fliptets[lVar9].tet[uVar2 & 3] =
         (tetrahedron)((long)bondtbl[(int)uVar2][(int)uVar17] | (ulong)pppdVar11);
    piVar12 = piVar12 + 4;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 8;
  do {
    uVar14 = *(ulong *)((long)fliptets + lVar7 + -8);
    uVar17 = eorgoppotbl[*(int *)((long)&fliptets->tet + lVar7)];
    uVar13 = *(ulong *)((long)&local_a0 + lVar7);
    uVar2 = *(uint *)((long)local_90 + lVar7 + -8);
    *(ulong *)(uVar14 + (ulong)(uVar17 & 3) * 8) = (long)bondtbl[(int)uVar17][(int)uVar2] | uVar13;
    *(ulong *)(uVar13 + (ulong)(uVar2 & 3) * 8) = (long)bondtbl[(int)uVar2][(int)uVar17] | uVar14;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  lVar7 = 8;
  do {
    pppdVar11 = *(tetrahedron **)((long)fliptets + lVar7 + -8);
    uVar17 = edestoppotbl[*(int *)((long)&fliptets->tet + lVar7)];
    uVar14 = *(ulong *)((long)&uStack_70 + lVar7);
    uVar2 = *(uint *)((long)local_60 + lVar7 + -8);
    pppdVar11[uVar17 & 3] = (tetrahedron)((long)bondtbl[(int)uVar17][(int)uVar2] | uVar14);
    *(ulong *)(uVar14 + (ulong)(uVar2 & 3) * 8) =
         (long)bondtbl[(int)uVar2][(int)uVar17] | (ulong)pppdVar11;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  if (this->checksubsegflag != 0) {
    lVar7 = 0;
    local_110.tet = pppdVar11;
    local_110.ver = uVar17;
    do {
      if ((*(long *)(*(long *)(local_90 + lVar7 * 4 + -2) + 0x40) != 0) &&
         (pdVar6 = *(double **)
                    (*(long *)(*(long *)(local_90 + lVar7 * 4 + -2) + 0x40) +
                    (long)ver2edge[(int)local_90[lVar7 * 4]] * 8), pdVar6 != (double *)0x0)) {
        pppdVar11 = fliptets[lVar7].tet;
        uVar17 = eorgoppotbl[fliptets[lVar7].ver];
        if (pppdVar11[8] == (tetrahedron)0x0) {
          ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar11[8] = ppdVar8;
          lVar9 = 0;
          do {
            pppdVar11[8][lVar9] = (double *)0x0;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
        }
        uVar14 = (ulong)pdVar6 & 0xfffffffffffffff8;
        pppdVar11[8][ver2edge[(int)uVar17]] = pdVar6;
        *(ulong *)(uVar14 + 0x48) = (long)(int)uVar17 | (ulong)pppdVar11;
        if ((local_f8->chkencflag & 1) != 0) {
          uVar2 = *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4);
          if ((uVar2 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4) = uVar2 | 4;
            puVar10 = (ulong *)memorypool::alloc(pmVar4);
            *puVar10 = uVar14;
            *(uint *)(puVar10 + 1) = (uint)pdVar6 & 7;
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    local_110.tet = pppdVar11;
    local_110.ver = uVar17;
    do {
      if ((*(long *)(*(long *)(local_90 + lVar7 * 4 + -2) + 0x40) != 0) &&
         (pdVar6 = *(double **)
                    (*(long *)(*(long *)(local_90 + lVar7 * 4 + -2) + 0x40) +
                    (long)ver2edge[eprevtbl[(int)local_90[lVar7 * 4]]] * 8), pdVar6 != (double *)0x0
         )) {
        pppdVar11 = fliptets[lVar7].tet;
        iVar16 = enexttbl[fliptets[lVar7].ver];
        if (pppdVar11[8] == (tetrahedron)0x0) {
          ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar11[8] = ppdVar8;
          lVar9 = 0;
          do {
            pppdVar11[8][lVar9] = (double *)0x0;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
        }
        uVar13 = (ulong)pdVar6 & 0xfffffffffffffff8;
        pppdVar11[8][ver2edge[iVar16]] = pdVar6;
        *(ulong *)(uVar13 + 0x48) = (ulong)pppdVar11 | (long)iVar16;
        uVar14 = (ulong)(((int)lVar7 + 2U) % 3 << 4);
        pppdVar11 = *(tetrahedron **)((long)&fliptets->tet + uVar14);
        uVar17 = eprevtbl[esymtbl[*(int *)((long)&fliptets->ver + uVar14)]];
        if (pppdVar11[8] == (tetrahedron)0x0) {
          ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar11[8] = ppdVar8;
          lVar9 = 0;
          do {
            pppdVar11[8][lVar9] = (double *)0x0;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
        }
        pppdVar11[8][ver2edge[(int)uVar17]] = pdVar6;
        *(ulong *)(uVar13 + 0x48) = (long)(int)uVar17 | (ulong)pppdVar11;
        if ((local_f8->chkencflag & 1) != 0) {
          uVar2 = *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4);
          if ((uVar2 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4) = uVar2 | 4;
            puVar10 = (ulong *)memorypool::alloc(pmVar4);
            *puVar10 = uVar13;
            *(uint *)(puVar10 + 1) = (uint)pdVar6 & 7;
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    local_110.tet = pppdVar11;
    local_110.ver = uVar17;
    do {
      if ((*(long *)(*(long *)(local_60 + lVar7 * 4 + -2) + 0x40) != 0) &&
         (pdVar6 = *(double **)
                    (*(long *)(*(long *)(local_60 + lVar7 * 4 + -2) + 0x40) +
                    (long)ver2edge[enexttbl[(int)local_60[lVar7 * 4]]] * 8), pdVar6 != (double *)0x0
         )) {
        pppdVar11 = fliptets[lVar7].tet;
        iVar16 = eprevtbl[fliptets[lVar7].ver];
        if (pppdVar11[8] == (tetrahedron)0x0) {
          ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar11[8] = ppdVar8;
          lVar9 = 0;
          do {
            pppdVar11[8][lVar9] = (double *)0x0;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
        }
        uVar13 = (ulong)pdVar6 & 0xfffffffffffffff8;
        pppdVar11[8][ver2edge[iVar16]] = pdVar6;
        *(ulong *)(uVar13 + 0x48) = (long)iVar16 | (ulong)pppdVar11;
        uVar14 = (ulong)(((int)lVar7 + 2U) % 3 << 4);
        pppdVar11 = *(tetrahedron **)((long)&fliptets->tet + uVar14);
        uVar17 = enexttbl[esymtbl[*(int *)((long)&fliptets->ver + uVar14)]];
        if (pppdVar11[8] == (tetrahedron)0x0) {
          ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar11[8] = ppdVar8;
          lVar9 = 0;
          do {
            pppdVar11[8][lVar9] = (double *)0x0;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 6);
        }
        pppdVar11[8][ver2edge[(int)uVar17]] = pdVar6;
        *(ulong *)(uVar13 + 0x48) = (long)(int)uVar17 | (ulong)pppdVar11;
        if ((local_f8->chkencflag & 1) != 0) {
          uVar2 = *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4);
          if ((uVar2 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4) = uVar2 | 4;
            puVar10 = (ulong *)memorypool::alloc(pmVar4);
            *puVar10 = uVar13;
            *(uint *)(puVar10 + 1) = (uint)pdVar6 & 7;
          }
        }
      }
      lVar7 = lVar7 + 1;
      p3 = local_d8;
    } while (lVar7 != 3);
  }
  local_110.ver = uVar17;
  local_110.tet = pppdVar11;
  pppdVar11 = local_110.tet;
  uVar17 = local_110.ver;
  if (this->checksubfaceflag != 0) {
    lVar7 = 0;
    do {
      if (*(long *)(*(long *)(local_90 + lVar7 * 4 + -2) + 0x48) != 0) {
        uVar14 = *(ulong *)(*(long *)(*(long *)(local_90 + lVar7 * 4 + -2) + 0x48) +
                           (ulong)(local_90[lVar7 * 4] & 3) * 8);
        if (uVar14 != 0) {
          iVar16 = tspivottbl[(int)local_90[lVar7 * 4]][(uint)uVar14 & 7];
          pppdVar11 = fliptets[lVar7].tet;
          uVar17 = eorgoppotbl[fliptets[lVar7].ver];
          if (pppdVar11[9] == (tetrahedron)0x0) {
            ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2subpool);
            pppdVar11[9] = ppdVar8;
            lVar9 = 0;
            do {
              pppdVar11[9][lVar9] = (double *)0x0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
          }
          uVar14 = uVar14 & 0xfffffffffffffff8;
          uVar13 = (long)iVar16 ^ 1;
          pppdVar11[9][uVar17 & 3] = (double *)((long)tsbondtbl[(int)uVar17][uVar13] | uVar14);
          *(ulong *)(uVar14 + 0x48 + (ulong)((uint)uVar13 & 1) * 8) =
               (long)stbondtbl[(int)uVar17][uVar13] | (ulong)pppdVar11;
          if ((local_f8->chkencflag & 2) != 0) {
            uVar2 = *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4);
            if ((uVar2 & 4) == 0) {
              pmVar4 = this->badsubfacs;
              *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4) = uVar2 | 4;
              puVar10 = (ulong *)memorypool::alloc(pmVar4);
              *puVar10 = uVar14;
              *(uint *)(puVar10 + 1) = (uint)uVar13;
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar7 = 0;
    local_110.tet = pppdVar11;
    local_110.ver = uVar17;
    do {
      if (*(long *)(*(long *)(local_60 + lVar7 * 4 + -2) + 0x48) != 0) {
        uVar14 = *(ulong *)(*(long *)(*(long *)(local_60 + lVar7 * 4 + -2) + 0x48) +
                           (ulong)(local_60[lVar7 * 4] & 3) * 8);
        if (uVar14 != 0) {
          iVar16 = tspivottbl[(int)local_60[lVar7 * 4]][(uint)uVar14 & 7];
          pppdVar11 = fliptets[lVar7].tet;
          uVar17 = edestoppotbl[fliptets[lVar7].ver];
          if (pppdVar11[9] == (tetrahedron)0x0) {
            ppdVar8 = (tetrahedron)memorypool::alloc(this->tet2subpool);
            pppdVar11[9] = ppdVar8;
            lVar9 = 0;
            do {
              pppdVar11[9][lVar9] = (double *)0x0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
          }
          uVar14 = uVar14 & 0xfffffffffffffff8;
          uVar13 = (long)iVar16 ^ 1;
          pppdVar11[9][uVar17 & 3] = (double *)((long)tsbondtbl[(int)uVar17][uVar13] | uVar14);
          *(ulong *)(uVar14 + 0x48 + (ulong)((uint)uVar13 & 1) * 8) =
               (long)stbondtbl[(int)uVar17][uVar13] | (ulong)pppdVar11;
          if ((local_f8->chkencflag & 2) != 0) {
            uVar2 = *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4);
            if ((uVar2 & 4) == 0) {
              pmVar4 = this->badsubfacs;
              *(uint *)(uVar14 + 4 + (long)this->shmarkindex * 4) = uVar2 | 4;
              puVar10 = (ulong *)memorypool::alloc(pmVar4);
              *puVar10 = uVar14;
              *(uint *)(puVar10 + 1) = (uint)uVar13;
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
      p3 = local_d8;
    } while (lVar7 != 3);
  }
  local_110.ver = uVar17;
  local_110.tet = pppdVar11;
  if ((local_f8->chkencflag & 4) != 0) {
    lVar7 = 0;
    do {
      enqueuetetrahedron(this,(triface *)((long)&fliptets->tet + lVar7));
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x30);
  }
  iVar16 = this->point2simindex;
  p3[iVar16] = (double *)fliptets->tet;
  local_e0[iVar16] = (double *)fliptets->tet;
  local_e8[iVar16] = (double *)fliptets[1].tet;
  local_a0[iVar16] = (double *)fliptets->tet;
  local_a8[iVar16] = (double *)fliptets->tet;
  if ((char)local_ec == '\x01' && 0 < local_cc) {
    if ((char)local_f0 == '\0') {
      pppdVar11 = fliptets->tet;
      iVar16 = fliptets->ver;
      if ((char)local_fc != '\0') {
        fliptets->tet = fliptets[2].tet;
        fliptets->ver = fliptets[2].ver;
        fliptets[2].tet = fliptets[1].tet;
        fliptets[2].ver = fliptets[1].ver;
        fliptets[1].tet = pppdVar11;
        fliptets[1].ver = iVar16;
        goto LAB_0011d880;
      }
      fliptets->tet = fliptets[1].tet;
      fliptets->ver = fliptets[1].ver;
    }
    else {
      lVar7 = 8;
      do {
        *(int *)((long)&fliptets->tet + lVar7) = esymtbl[*(int *)((long)&fliptets->tet + lVar7)];
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x38);
      pppdVar11 = fliptets[1].tet;
      iVar16 = fliptets[1].ver;
    }
    fliptets[1].tet = fliptets[2].tet;
    fliptets[1].ver = fliptets[2].ver;
    fliptets[2].tet = pppdVar11;
    fliptets[2].ver = iVar16;
  }
LAB_0011d880:
  if (0 < local_f8->enqflag) {
    lVar7 = 8;
    do {
      local_110.tet = *(tetrahedron **)((long)fliptets + lVar7 + -8);
      local_110.ver = eprevesymtbl[*(int *)((long)&fliptets->tet + lVar7)];
      flippush(this,&this->flipstack,&local_110);
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x38);
    if (1 < local_f8->enqflag) {
      lVar7 = 8;
      do {
        local_110.tet = *(tetrahedron **)((long)fliptets + lVar7 + -8);
        local_110.ver = enextesymtbl[*(int *)((long)&fliptets->tet + lVar7)];
        flippush(this,&this->flipstack,&local_110);
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x38);
    }
  }
  (this->recenttet).tet = fliptets->tet;
  (this->recenttet).ver = fliptets->ver;
  return;
}

Assistant:

void tetgenmesh::flip23(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // range = {-1, 0, 1, 2}.
  int i;

  if (hullflag > 0) {
    // Check if e is dummypoint.
    if (oppo(fliptets[1]) == dummypoint) {
      // Swap the two old tets.
      newface = fliptets[0];
      fliptets[0] = fliptets[1];
      fliptets[1] = newface;
      dummyflag = -1;  // d is dummypoint.
    } else {
      // Check if either a or b is dummypoint.
      if (org(fliptets[0]) == dummypoint) {
        dummyflag = 1; // a is dummypoint.
        enextself(fliptets[0]);
        eprevself(fliptets[1]);
      } else if (dest(fliptets[0]) == dummypoint) {
        dummyflag = 2; // b is dummypoint.
        eprevself(fliptets[0]);
        enextself(fliptets[1]);
      } else {
        dummyflag = 0; // either c or d may be dummypoint.
      }
    }
  }

  pa =  org(fliptets[0]);
  pb = dest(fliptets[0]);
  pc = apex(fliptets[0]);
  pd = oppo(fliptets[0]);
  pe = oppo(fliptets[1]);

  flip23count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    fnext(fliptets[0], topcastets[i]);
    enextself(fliptets[0]);
  }
  for (i = 0; i < 3; i++) {
    fnext(fliptets[1], botcastets[i]);
    eprevself(fliptets[1]);
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  // Create a new tet.
  maketetrahedron(&(fliptets[2]));
  // The new tet have the same attributes from the old tet.
  for (i = 0; i < numelemattrib; i++) {
    attrib = elemattribute(fliptets[0].tet, i);
    setelemattribute(fliptets[2].tet, i, attrib);
  }
  if (b->varvolume) {
    volume = volumebound(fliptets[0].tet);
    setvolumebound(fliptets[2].tet, volume);
  }

  if (hullflag > 0) {
    // Check if d is dummytet.
    if (pd != dummypoint) {
      setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
      setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
      // Check if c is dummypoint.
      if (pc != dummypoint) {
        setvertices(fliptets[2], pe, pd, pc, pa);  // [e,d,c,a] *
      } else {
        setvertices(fliptets[2], pd, pe, pa, pc); // [d,e,a,c]
        esymself(fliptets[2]);                    // [e,d,c,a] *
      }
      // The hullsize does not change.
    } else {
      // d is dummypoint.
      setvertices(fliptets[0], pa, pb, pe, pd); // [a,b,e,d]
      setvertices(fliptets[1], pb, pc, pe, pd); // [b,c,e,d]
      setvertices(fliptets[2], pc, pa, pe, pd); // [c,a,e,d]
      // Adjust the faces to [e,d,a,b], [e,d,b,c], [e,d,c,a] *
      for (i = 0; i < 3; i++) {
        eprevesymself(fliptets[i]);
        enextself(fliptets[i]);
      }
      // We deleted one hull tet, and created three hull tets.
      hullsize += 2;
    }
  } else {
    setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
    setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
    setvertices(fliptets[2], pe, pd, pc, pa); // [e,d,c,a] *
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[2], volpos[3], vol_diff;
    if (pd != dummypoint) {
      if (pc != dummypoint) {
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = tetprismvol(pe, pd, pb, pc);
        volpos[2] = tetprismvol(pe, pd, pc, pa);
        volneg[0] = tetprismvol(pa, pb, pc, pd);
        volneg[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pc == dummypoint
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = 0.;
        volpos[2] = 0.;
        volneg[0] = 0.;
        volneg[1] = 0.;
      }
    } else { // pd == dummypoint.
      volpos[0] = 0.;
      volpos[1] = 0.;
      volpos[2] = 0.;
      volneg[0] = 0.;
      volneg[1] = tetprismvol(pb, pa, pc, pe);
    }
    vol_diff = volpos[0] + volpos[1] + volpos[2] - volneg[0] - volneg[1];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond three new tets together.
  for (i = 0; i < 3; i++) {
    esym(fliptets[i], newface);
    bond(newface, fliptets[(i + 1) % 3]);
  }
  // Bond to top outer boundary faces (at [a,b,c,d]).
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], newface); // At edges [b,a], [c,b], [a,c].
    bond(newface, topcastets[i]);
  }
  // Bond bottom outer boundary faces (at [b,a,c,e]).
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], newface); // At edges [a,b], [b,c], [c,a].
    bond(newface, botcastets[i]);
  }

  if (checksubsegflag) {
    // Bond subsegments if there are.
    // Each new tet has 5 edges to be checked (except the edge [e,d]). 
    face checkseg;
    // The middle three: [a,b], [b,c], [c,a].
    for (i = 0; i < 3; i++) {      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        eorgoppo(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The top three: [d,a], [d,b], [d,c]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        enext(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        eprevself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The bot three: [a,e], [b,e], [c,e]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      enext(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        eprev(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        enextself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    // Bond 6 subfaces if there are.
    face checksh;
    for (i = 0; i < 3; i++) {      
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        eorgoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
    for (i = 0; i < 3; i++) {
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        edestoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put three new tets into check list.
    for (i = 0; i < 3; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[1].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[0].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) { 
        // Reverse the edge.
        for (i = 0; i < 3; i++) {
          esymself(fliptets[i]);
        }
        // Swap the last two new tets.
        newface = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else {
        // either a or b were swapped.
        if (dummyflag == 1) {
          // a is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[2];
          fliptets[2] = fliptets[1];
          fliptets[1] = newface;
        } else { // dummyflag == 2
          // b is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[1];
          fliptets[1] = fliptets[2];
          fliptets[2] = newface;
        }
      }
    }
  }

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.  
    for (i = 0; i < 3; i++) {
      eprevesym(fliptets[i], newface);
      flippush(flipstack, &newface);
    }
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        enextesym(fliptets[i], newface);
        flippush(flipstack, &newface);
      }
    }
  }

  recenttet = fliptets[0];
}